

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Fl_Help_Dialog.cxx
# Opt level: O2

void __thiscall Fl_Help_Dialog::value(Fl_Help_Dialog *this,char *f)

{
  uint *puVar1;
  Fl_Help_View *this_00;
  
  this_00 = this->view_;
  puVar1 = &(this_00->super_Fl_Group).super_Fl_Widget.flags_;
  *puVar1 = *puVar1 | 0x80;
  Fl_Help_View::value(this_00,f);
  Fl_Window::label(&this->window_->super_Fl_Window,this->view_->title_);
  return;
}

Assistant:

void Fl_Help_Dialog::value(const char *f) {
  view_->set_changed();
  view_->value(f);
  window_->label(view_->title());
}